

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprintconv.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"",&local_49);
  std::__cxx11::string::string((string *)&local_48,"",&local_4a);
  initstreams(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  doit();
  return 0;
}

Assistant:

int main(int, char**) {
    initstreams();
    doit();    
}